

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall Engine::saveCurrentSolution(Engine *this)

{
  IntVar **ppIVar1;
  IntVar *pIVar2;
  lbool lVar3;
  lbool lVar4;
  char *pcVar5;
  bool *pbVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  pbVar6 = sat.polarity.data;
  pcVar5 = sat.assigns.data;
  lVar4.value = ::l_False.value;
  lVar3.value = ::l_True.value;
  uVar7 = (ulong)sat.assigns.sz;
  if (uVar7 != 0) {
    uVar8 = 0;
    do {
      if (lVar3.value == pcVar5[uVar8]) {
        bVar9 = false;
LAB_001b642f:
        pbVar6[uVar8] = bVar9;
      }
      else {
        bVar9 = true;
        if (lVar4.value == pcVar5[uVar8]) goto LAB_001b642f;
      }
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  uVar7 = (ulong)(this->vars).sz;
  if (uVar7 != 0) {
    ppIVar1 = (this->vars).data;
    uVar8 = 0;
    do {
      pIVar2 = ppIVar1[uVar8];
      pIVar2->last_solution_value = (pIVar2->min).v;
      if (pIVar2->sbps_value_selection == false) {
        pIVar2->sbps_value_selection = true;
      }
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  return;
}

Assistant:

void Engine::saveCurrentSolution() {
	sat.saveCurrentPolarities();                      // SAT vars
	for (unsigned int i = 0; i < vars.size(); i++) {  // Int vars
		vars[i]->saveCurrentValue();
	}
}